

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::DescriptorPool::InternalAddGeneratedFile
               (void *encoded_file_descriptor,int size)

{
  bool bVar1;
  int in_stack_0000010c;
  void *in_stack_00000110;
  EncodedDescriptorDatabase *in_stack_00000118;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *this;
  undefined8 in_stack_ffffffffffffff98;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffffa0;
  LogMessage local_48;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  anon_unknown_1::GeneratedDatabase();
  bVar1 = EncodedDescriptorDatabase::Add(in_stack_00000118,in_stack_00000110,in_stack_0000010c);
  if (!bVar1) {
    this = &local_48;
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffffa0,level,(char *)this,in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (this,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x4aa583);
  }
  return;
}

Assistant:

void DescriptorPool::InternalAddGeneratedFile(
    const void* encoded_file_descriptor, int size) {
  // So, this function is called in the process of initializing the
  // descriptors for generated proto classes.  Each generated .pb.cc file
  // has an internal procedure called AddDescriptors() which is called at
  // process startup, and that function calls this one in order to register
  // the raw bytes of the FileDescriptorProto representing the file.
  //
  // We do not actually construct the descriptor objects right away.  We just
  // hang on to the bytes until they are actually needed.  We actually construct
  // the descriptor the first time one of the following things happens:
  // * Someone calls a method like descriptor(), GetDescriptor(), or
  //   GetReflection() on the generated types, which requires returning the
  //   descriptor or an object based on it.
  // * Someone looks up the descriptor in DescriptorPool::generated_pool().
  //
  // Once one of these happens, the DescriptorPool actually parses the
  // FileDescriptorProto and generates a FileDescriptor (and all its children)
  // based on it.
  //
  // Note that FileDescriptorProto is itself a generated protocol message.
  // Therefore, when we parse one, we have to be very careful to avoid using
  // any descriptor-based operations, since this might cause infinite recursion
  // or deadlock.
  GOOGLE_CHECK(GeneratedDatabase()->Add(encoded_file_descriptor, size));
}